

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O2

object_t * __thiscall
acto::intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::pop
          (queue<acto::core::object_t,_acto::intrusive::spin_lock> *this)

{
  object_t *poVar1;
  object_t *poVar2;
  
  spin_lock::lock(&this->mutex_);
  poVar1 = this->tail_;
  if (poVar1 == (object_t *)0x0) {
    poVar2 = (object_t *)0x0;
  }
  else {
    poVar2 = (poVar1->super_node<acto::core::object_t>).next;
    if (poVar2 == poVar1) {
      this->tail_ = (object_t *)0x0;
    }
    else {
      (poVar1->super_node<acto::core::object_t>).next =
           (poVar2->super_node<acto::core::object_t>).next;
    }
    (poVar2->super_node<acto::core::object_t>).next = (object_t *)0x0;
  }
  spin_lock::unlock(&this->mutex_);
  return poVar2;
}

Assistant:

T* pop() {
    std::lock_guard g(mutex_);

    if (tail_) {
      T* result = tail_->next;

      if (result == tail_)
        tail_ = nullptr;
      else
        tail_->next = tail_->next->next;

      result->next = nullptr;
      return result;
    }
    return nullptr;
  }